

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_derive.cpp
# Opt level: O2

void pelelm_dergrdpy(Box *bx,FArrayBox *derfab,int dcomp,int ncomp,FArrayBox *datfab,
                    Geometry *geomdata,Real param_7,int *param_8,int param_9)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  double *pdVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  double *pdVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  double *pdVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long local_c0;
  double *local_b0;
  
  iVar2 = (datfab->super_BaseFab<double>).domain.smallend.vect[1];
  lVar12 = (long)iVar2;
  iVar3 = (datfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar15 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar2) + 1);
  iVar4 = (derfab->super_BaseFab<double>).domain.smallend.vect[0];
  iVar5 = (derfab->super_BaseFab<double>).domain.smallend.vect[1];
  iVar6 = (derfab->super_BaseFab<double>).domain.smallend.vect[2];
  lVar30 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[0] - iVar4) + 1);
  lVar24 = (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[1] - iVar5) + 1);
  dVar1 = (geomdata->super_CoordSys).inv_dx[1];
  iVar7 = (bx->smallend).vect[0];
  lVar28 = (long)iVar7;
  iVar22 = (bx->smallend).vect[2];
  lVar26 = (long)iVar22;
  iVar8 = (bx->smallend).vect[1];
  lVar21 = (long)iVar8;
  lVar31 = ((lVar26 * 8 +
             (long)dcomp *
             (long)(((derfab->super_BaseFab<double>).domain.bigend.vect[2] - iVar6) + 1) * 8 +
            (long)iVar6 * -8) * lVar24 + lVar21 * 8 + (long)iVar5 * -8) * lVar30 + lVar28 * 8 +
           (long)iVar4 * -8 + (long)(derfab->super_BaseFab<double>).dptr;
  lVar17 = (lVar26 - iVar3) * lVar15;
  iVar4 = (datfab->super_BaseFab<double>).domain.smallend.vect[0];
  lVar16 = (long)(((datfab->super_BaseFab<double>).domain.bigend.vect[0] - iVar4) + 1);
  pdVar10 = (datfab->super_BaseFab<double>).dptr;
  lVar34 = lVar15 * lVar16;
  iVar5 = (bx->bigend).vect[0];
  iVar6 = (bx->bigend).vect[1];
  iVar9 = (bx->bigend).vect[2];
  pdVar19 = pdVar10 + (lVar28 - iVar4);
  iVar22 = iVar22 - iVar3;
  local_c0 = (lVar21 * 8 + lVar17 * 8 + lVar12 * -8) * lVar16 + lVar28 * 8 + (long)iVar4 * -8 +
             (long)pdVar10;
  local_b0 = pdVar19;
  while (iVar22 = iVar22 + 1, lVar26 <= iVar9) {
    lVar13 = (long)iVar22 * lVar15 * 8;
    pdVar23 = (double *)((lVar21 * 8 + lVar12 * -8 + lVar13) * lVar16 + (long)pdVar19);
    lVar18 = (lVar26 - iVar3) * lVar34;
    lVar26 = lVar26 + 1;
    lVar20 = ((int)lVar26 - iVar3) * lVar34;
    lVar28 = lVar21;
    lVar25 = lVar31;
    lVar27 = local_c0;
    iVar11 = iVar8 - iVar2;
    while (iVar11 = iVar11 + 1, lVar28 <= iVar6) {
      if (iVar7 <= iVar5) {
        lVar33 = ((int)(lVar28 + 1) - iVar2) * lVar16;
        lVar14 = (lVar28 - lVar12) * lVar16;
        lVar32 = 0;
        do {
          lVar29 = (long)((iVar7 - iVar4) + 1 + (int)lVar32);
          *(double *)(lVar25 + lVar32 * 8) =
               (((((((*(double *)
                       ((long)local_b0 + lVar32 * 8 + (lVar17 * 8 + (long)iVar11 * 8) * lVar16) -
                     *(double *)(lVar27 + lVar32 * 8)) + pdVar10[lVar33 + lVar29 + lVar18]) -
                   pdVar10[lVar14 + lVar29 + lVar18]) +
                  *(double *)((long)pdVar19 + lVar32 * 8 + (lVar13 + (long)iVar11 * 8) * lVar16)) -
                 pdVar23[lVar32]) + pdVar10[lVar33 + lVar29 + lVar20]) -
               pdVar10[lVar14 + lVar29 + lVar20]) * dVar1 * 0.25;
          lVar32 = lVar32 + 1;
        } while ((iVar5 - iVar7) + 1 != (int)lVar32);
      }
      lVar25 = lVar25 + lVar30 * 8;
      pdVar23 = pdVar23 + lVar16;
      lVar27 = lVar27 + lVar16 * 8;
      lVar28 = lVar28 + 1;
    }
    lVar31 = lVar31 + lVar24 * lVar30 * 8;
    local_c0 = local_c0 + lVar34 * 8;
    local_b0 = local_b0 + lVar34;
  }
  return;
}

Assistant:

void pelelm_dergrdpy (const Box& bx, FArrayBox& derfab, int dcomp, int ncomp,
                      const FArrayBox& datfab, const Geometry& geomdata,
                      Real /*time*/, const int* /*bcrec*/, int /*level*/)

{
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(Box(datfab.box()).enclosedCells().contains(bx));
    AMREX_ASSERT(derfab.nComp() >= dcomp + ncomp);
    AMREX_ASSERT(datfab.nComp() >= 1);
    AMREX_ASSERT(ncomp == 1);
    auto const in_dat = datfab.array();
    auto          der = derfab.array(dcomp);
    const auto dxinv = geomdata.InvCellSizeArray();
#if (AMREX_SPACEDIM == 2 )
    Real factor = 0.5*dxinv[1];
#elif (AMREX_SPACEDIM == 3 )
    Real factor = 0.25*dxinv[1];
#endif
    amrex::ParallelFor(bx,
    [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
#if (AMREX_SPACEDIM == 2 )
        der(i,j,k) = factor*(in_dat(i,j+1,k)-in_dat(i,j,k)+in_dat(i+1,j+1,k)-in_dat(i+1,j,k));
#elif (AMREX_SPACEDIM == 3 )
        der(i,j,k) = factor*( in_dat(i,j+1,k)-in_dat(i,j,k)+in_dat(i+1,j+1,k)-in_dat(i+1,j,k) +
                              in_dat(i,j+1,k+1)-in_dat(i,j,k+1)+in_dat(i+1,j+1,k+1)-in_dat(i+1,j,k+1));
#endif
    });
}